

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

SchnorrPubkey * __thiscall
cfd::core::SchnorrSignature::GetNonce(SchnorrPubkey *__return_storage_ptr__,SchnorrSignature *this)

{
  allocator<unsigned_char> local_79;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_78;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  ByteData local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  SchnorrSignature *this_local;
  
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,&this->data_)
  ;
  local_68._M_current =
       (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(local_30);
  local_78._M_current =
       (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(local_30);
  local_70 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_78,0x20);
  ::std::allocator<unsigned_char>::allocator(&local_79);
  ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_60,local_68,local_70,
             &local_79);
  ByteData::ByteData(&local_48,&local_60);
  SchnorrPubkey::SchnorrPubkey(__return_storage_ptr__,&local_48);
  ByteData::~ByteData(&local_48);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60);
  ::std::allocator<unsigned_char>::~allocator(&local_79);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_30);
  return __return_storage_ptr__;
}

Assistant:

SchnorrPubkey SchnorrSignature::GetNonce() const {
  auto bytes = data_.GetBytes();
  return SchnorrPubkey(ByteData(std::vector<uint8_t>(
      bytes.begin(), bytes.begin() + SchnorrPubkey::kSchnorrPubkeySize)));
}